

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_collapse_rail.cpp
# Opt level: O1

void Omega_h::find_rails(Mesh *mesh,LOs *keys2verts,Read<long> *verts2rail,LOs *rails2edges,
                        Read<signed_char> *rail_col_dirs)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  Alloc *pAVar6;
  element_type *peVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  LO size_in;
  size_t sVar11;
  Write<signed_char> rail_col_dirs_w;
  Write<int> rails2edges_w;
  Read<signed_char> ve_codes;
  LOs ve2e;
  LOs v2ve;
  type f;
  Read<long> edge_globals;
  Adj v2e;
  Write<signed_char> local_268;
  Write<int> local_258;
  Alloc *local_248;
  element_type *local_240;
  Alloc *local_238;
  element_type *local_230;
  Alloc *local_228;
  element_type *local_220;
  string local_218;
  Alloc *local_1f8;
  element_type *local_1f0;
  Alloc *local_1e8;
  element_type *local_1e0;
  Alloc *local_1d8;
  element_type *local_1d0;
  Alloc *local_1c8;
  element_type *local_1c0;
  Alloc *local_1b8;
  pointer local_1b0;
  Alloc *local_1a8;
  pointer local_1a0;
  Alloc *local_198;
  void *local_190;
  Alloc *local_188;
  void *local_180;
  Alloc *local_178;
  element_type *local_170;
  Alloc *local_168;
  element_type *local_160;
  Alloc *local_158;
  element_type *local_150;
  Alloc *local_148;
  element_type *local_140;
  Alloc *local_138;
  pointer local_130;
  Alloc *local_128;
  pointer local_120;
  Write<signed_char> local_118;
  Write<int> local_108;
  Alloc *local_f8;
  element_type *local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  void *pvStack_e0;
  Alloc *local_d8;
  void *pvStack_d0;
  Alloc *local_c8;
  element_type *peStack_c0;
  Alloc *local_b8;
  element_type *peStack_b0;
  Alloc *local_a8;
  element_type *peStack_a0;
  Alloc *local_98;
  element_type *peStack_90;
  Alloc *local_88;
  pointer psStack_80;
  Alloc *local_78;
  pointer psStack_70;
  element_type *local_68;
  Adj local_60;
  
  pAVar6 = (keys2verts->write_).shared_alloc_.alloc;
  if (((ulong)pAVar6 & 1) == 0) {
    sVar11 = pAVar6->size;
  }
  else {
    sVar11 = (ulong)pAVar6 >> 3;
  }
  local_68 = (element_type *)rail_col_dirs;
  Mesh::ask_up(&local_60,mesh,0,1);
  local_228 = local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_228 = (Alloc *)((long)(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 +
                           1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_220 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_238 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_238 = (Alloc *)((long)(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 +
                           1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_230 = (element_type *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_248 = local_60.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_248 = (Alloc *)((long)(local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_240 = (element_type *)local_60.codes.write_.shared_alloc_.direct_ptr;
  paVar2 = &local_218.field_2;
  local_218._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
  size_in = (LO)(sVar11 >> 2);
  Write<int>::Write(&local_258,size_in,-1,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar2) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  local_218._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
  Write<signed_char>::Write(&local_268,size_in,-1,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar2) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  Mesh::globals((Mesh *)&local_f8,(Int)mesh);
  local_198 = (keys2verts->write_).shared_alloc_.alloc;
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198 = (Alloc *)(local_198->size * 8 + 1);
    }
    else {
      local_198->use_count = local_198->use_count + 1;
    }
  }
  local_190 = (keys2verts->write_).shared_alloc_.direct_ptr;
  local_188 = (verts2rail->write_).shared_alloc_.alloc;
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_188 = (Alloc *)(local_188->size * 8 + 1);
    }
    else {
      local_188->use_count = local_188->use_count + 1;
    }
  }
  local_180 = (verts2rail->write_).shared_alloc_.direct_ptr;
  local_178 = local_228;
  if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178 = (Alloc *)(local_228->size * 8 + 1);
    }
    else {
      local_228->use_count = local_228->use_count + 1;
    }
  }
  local_170 = local_220;
  local_168 = local_238;
  if (((ulong)local_238 & 7) == 0 && local_238 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168 = (Alloc *)(local_238->size * 8 + 1);
    }
    else {
      local_238->use_count = local_238->use_count + 1;
    }
  }
  local_160 = local_230;
  local_158 = local_f8;
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158 = (Alloc *)(local_f8->size * 8 + 1);
    }
    else {
      local_f8->use_count = local_f8->use_count + 1;
    }
  }
  local_150 = local_f0;
  local_148 = local_248;
  if (((ulong)local_248 & 7) == 0 && local_248 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148 = (Alloc *)(local_248->size * 8 + 1);
    }
    else {
      local_248->use_count = local_248->use_count + 1;
    }
  }
  local_140 = local_240;
  local_138 = local_258.shared_alloc_.alloc;
  if (((ulong)local_258.shared_alloc_.alloc & 7) == 0 &&
      local_258.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_138 = (Alloc *)((local_258.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_258.shared_alloc_.alloc)->use_count = (local_258.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_130 = (pointer)local_258.shared_alloc_.direct_ptr;
  local_128 = local_268.shared_alloc_.alloc;
  if (((ulong)local_268.shared_alloc_.alloc & 7) == 0 &&
      local_268.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128 = (Alloc *)((local_268.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_268.shared_alloc_.alloc)->use_count = (local_268.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_120 = (pointer)local_268.shared_alloc_.direct_ptr;
  local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198;
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_198->size * 8 + 1);
    }
    else {
      local_198->use_count = local_198->use_count + 1;
    }
  }
  local_d8 = local_188;
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8 = (Alloc *)(local_188->size * 8 + 1);
    }
    else {
      local_188->use_count = local_188->use_count + 1;
    }
  }
  local_c8 = local_178;
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)(local_178->size * 8 + 1);
    }
    else {
      local_178->use_count = local_178->use_count + 1;
    }
  }
  peStack_c0 = local_220;
  local_b8 = local_168;
  if (((ulong)local_168 & 7) == 0 && local_168 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)(local_168->size * 8 + 1);
    }
    else {
      local_168->use_count = local_168->use_count + 1;
    }
  }
  peStack_b0 = local_230;
  local_a8 = local_158;
  if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8 = (Alloc *)(local_158->size * 8 + 1);
    }
    else {
      local_158->use_count = local_158->use_count + 1;
    }
  }
  peStack_a0 = local_f0;
  local_98 = local_148;
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)(local_148->size * 8 + 1);
    }
    else {
      local_148->use_count = local_148->use_count + 1;
    }
  }
  peStack_90 = local_240;
  local_88 = local_138;
  if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)(local_138->size * 8 + 1);
    }
    else {
      local_138->use_count = local_138->use_count + 1;
    }
  }
  psStack_80 = (pointer)local_258.shared_alloc_.direct_ptr;
  local_78 = local_128;
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)(local_128->size * 8 + 1);
    }
    else {
      local_128->use_count = local_128->use_count + 1;
    }
  }
  psStack_70 = (pointer)local_268.shared_alloc_.direct_ptr;
  pvStack_e0 = local_190;
  pvStack_d0 = local_180;
  if (0 < size_in) {
    local_218._M_dataplus._M_p = (pointer)local_e8._M_pi;
    if (((ulong)local_e8._M_pi & 7) == 0 && (Alloc *)local_e8._M_pi != (Alloc *)0x0) {
      *(int *)&local_e8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_e8._M_pi[3]._vptr__Sp_counted_base + -1;
      local_218._M_dataplus._M_p = (pointer)((long)(local_e8._M_pi)->_vptr__Sp_counted_base * 8 + 1)
      ;
    }
    local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pvStack_e0 = (void *)0x0;
    local_218.field_2._M_allocated_capacity = (size_type)local_d8;
    if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
      local_d8->use_count = local_d8->use_count + -1;
      local_218.field_2._M_allocated_capacity = local_d8->size * 8 + 1;
    }
    local_d8 = (Alloc *)0x0;
    pvStack_d0 = (void *)0x0;
    local_1f8 = local_c8;
    local_1f0 = local_220;
    if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
      local_c8->use_count = local_c8->use_count + -1;
      local_1f8 = (Alloc *)(local_c8->size * 8 + 1);
    }
    local_c8 = (Alloc *)0x0;
    peStack_c0 = (element_type *)0x0;
    local_1e8 = local_b8;
    local_1e0 = local_230;
    if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
      local_b8->use_count = local_b8->use_count + -1;
      local_1e8 = (Alloc *)(local_b8->size * 8 + 1);
    }
    local_b8 = (Alloc *)0x0;
    peStack_b0 = (element_type *)0x0;
    local_1d8 = local_a8;
    local_1d0 = local_f0;
    if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
      local_a8->use_count = local_a8->use_count + -1;
      local_1d8 = (Alloc *)(local_a8->size * 8 + 1);
    }
    local_a8 = (Alloc *)0x0;
    peStack_a0 = (element_type *)0x0;
    local_1c8 = local_98;
    local_1c0 = local_240;
    if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
      local_98->use_count = local_98->use_count + -1;
      local_1c8 = (Alloc *)(local_98->size * 8 + 1);
    }
    local_98 = (Alloc *)0x0;
    peStack_90 = (element_type *)0x0;
    local_1b8 = local_88;
    local_1b0 = (pointer)local_258.shared_alloc_.direct_ptr;
    if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
      local_88->use_count = local_88->use_count + -1;
      local_1b8 = (Alloc *)(local_88->size * 8 + 1);
    }
    local_88 = (Alloc *)0x0;
    psStack_80 = (pointer)0x0;
    local_1a8 = local_78;
    local_1a0 = (pointer)local_268.shared_alloc_.direct_ptr;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      local_78->use_count = local_78->use_count + -1;
      local_1a8 = (Alloc *)(local_78->size * 8 + 1);
    }
    local_78 = (Alloc *)0x0;
    psStack_70 = (pointer)0x0;
    entering_parallel = '\0';
    lVar9 = 0;
    do {
      lVar10 = (long)*(int *)((long)local_190 + lVar9 * 4);
      iVar4 = *(int *)((long)&(local_220->super_Graph).a2ab.write_.shared_alloc_.alloc + lVar10 * 4)
      ;
      lVar8 = (long)iVar4;
      iVar5 = *(int *)((long)&(local_220->super_Graph).a2ab.write_.shared_alloc_.alloc +
                      lVar10 * 4 + 4);
      local_218._M_string_length = (size_type)local_190;
      local_218.field_2._8_8_ = local_180;
      if (iVar5 <= iVar4) {
LAB_00267695:
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_collapse_rail.cpp"
             ,0x67);
      }
      while (iVar4 = *(int *)((long)&(local_230->super_Graph).a2ab.write_.shared_alloc_.alloc +
                             lVar8 * 4),
            (&local_f0->library_)[iVar4] != *(Library **)((long)local_180 + lVar10 * 8)) {
        lVar8 = lVar8 + 1;
        if (iVar5 == lVar8) goto LAB_00267695;
      }
      cVar3 = *(char *)((long)&(local_240->super_Graph).a2ab.write_.shared_alloc_.alloc + lVar8);
      *(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                      local_258.shared_alloc_.direct_ptr)->_M_ptr + lVar9 * 4) = iVar4;
      *(char *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                       local_268.shared_alloc_.direct_ptr)->_M_ptr + lVar9) = cVar3 >> 3;
      lVar9 = lVar9 + 1;
    } while ((int)lVar9 != size_in);
    find_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<int>*,Omega_h::Read<signed_char>*)
    ::$_0::~__0((__0 *)&local_218);
  }
  find_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<int>*,Omega_h::Read<signed_char>*)
  ::$_0::~__0((__0 *)&local_e8);
  local_108.shared_alloc_.alloc = local_258.shared_alloc_.alloc;
  if (((ulong)local_258.shared_alloc_.alloc & 7) == 0 &&
      local_258.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108.shared_alloc_.alloc = (Alloc *)((local_258.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_258.shared_alloc_.alloc)->use_count = (local_258.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_108.shared_alloc_.direct_ptr = local_258.shared_alloc_.direct_ptr;
  Read<int>::Read((Read<signed_char> *)&local_218,&local_108);
  pAVar6 = (rails2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar6 & 7) == 0 && pAVar6 != (Alloc *)0x0) {
    piVar1 = &pAVar6->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar6);
      operator_delete(pAVar6,0x48);
    }
  }
  (rails2edges->write_).shared_alloc_.alloc = (Alloc *)local_218._M_dataplus._M_p;
  (rails2edges->write_).shared_alloc_.direct_ptr = (void *)local_218._M_string_length;
  if ((((ulong)local_218._M_dataplus._M_p & 7) == 0 &&
       (Alloc *)local_218._M_dataplus._M_p != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    *(int *)(local_218._M_dataplus._M_p + 0x30) = *(int *)(local_218._M_dataplus._M_p + 0x30) + -1;
    (rails2edges->write_).shared_alloc_.alloc =
         (Alloc *)(*(long *)local_218._M_dataplus._M_p * 8 + 1);
  }
  peVar7 = local_68;
  pAVar6 = local_108.shared_alloc_.alloc;
  local_218._M_dataplus._M_p = (pointer)0x0;
  local_218._M_string_length = 0;
  if (((ulong)local_108.shared_alloc_.alloc & 7) == 0 &&
      local_108.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_108.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_108.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  local_118.shared_alloc_.alloc = local_268.shared_alloc_.alloc;
  if (((ulong)local_268.shared_alloc_.alloc & 7) == 0 &&
      local_268.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_118.shared_alloc_.alloc = (Alloc *)((local_268.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_268.shared_alloc_.alloc)->use_count = (local_268.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_118.shared_alloc_.direct_ptr = local_268.shared_alloc_.direct_ptr;
  Read<signed_char>::Read((Read<signed_char> *)&local_218,&local_118);
  pAVar6 = ((SharedAlloc *)&(peVar7->super_Graph).a2ab)->alloc;
  if (((ulong)pAVar6 & 7) == 0 && pAVar6 != (Alloc *)0x0) {
    piVar1 = &pAVar6->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar6);
      operator_delete(pAVar6,0x48);
    }
  }
  pAVar6 = local_118.shared_alloc_.alloc;
  ((SharedAlloc *)&(peVar7->super_Graph).a2ab)->alloc = (Alloc *)local_218._M_dataplus._M_p;
  ((SharedAlloc *)&(peVar7->super_Graph).a2ab)->direct_ptr = (void *)local_218._M_string_length;
  if ((((ulong)local_218._M_dataplus._M_p & 7) == 0 &&
       (Alloc *)local_218._M_dataplus._M_p != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    *(int *)(local_218._M_dataplus._M_p + 0x30) = *(int *)(local_218._M_dataplus._M_p + 0x30) + -1;
    ((SharedAlloc *)&(peVar7->super_Graph).a2ab)->alloc =
         (Alloc *)(*(long *)local_218._M_dataplus._M_p * 8 + 1);
  }
  local_218._M_dataplus._M_p = (pointer)0x0;
  local_218._M_string_length = 0;
  if (((ulong)local_118.shared_alloc_.alloc & 7) == 0 &&
      local_118.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_118.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_118.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  find_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<int>*,Omega_h::Read<signed_char>*)
  ::$_0::~__0((__0 *)&local_198);
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
    piVar1 = &local_f8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_f8);
      operator_delete(local_f8,0x48);
    }
  }
  if (((ulong)local_268.shared_alloc_.alloc & 7) == 0 &&
      local_268.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_268.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_268.shared_alloc_.alloc);
      operator_delete(local_268.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_258.shared_alloc_.alloc & 7) == 0 &&
      local_258.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_258.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_258.shared_alloc_.alloc);
      operator_delete(local_258.shared_alloc_.alloc,0x48);
    }
  }
  pAVar6 = local_248;
  if (((ulong)local_248 & 7) == 0 && local_248 != (Alloc *)0x0) {
    piVar1 = &local_248->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_248);
      operator_delete(pAVar6,0x48);
    }
  }
  pAVar6 = local_238;
  if (((ulong)local_238 & 7) == 0 && local_238 != (Alloc *)0x0) {
    piVar1 = &local_238->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_238);
      operator_delete(pAVar6,0x48);
    }
  }
  pAVar6 = local_228;
  if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
    piVar1 = &local_228->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_228);
      operator_delete(pAVar6,0x48);
    }
  }
  Adj::~Adj(&local_60);
  return;
}

Assistant:

void find_rails(Mesh* mesh, LOs keys2verts, Read<GO> verts2rail,
    LOs* rails2edges, Read<I8>* rail_col_dirs) {
  auto nkeys = keys2verts.size();
  auto v2e = mesh->ask_up(VERT, EDGE);
  auto v2ve = v2e.a2ab;
  auto ve2e = v2e.ab2b;
  auto ve_codes = v2e.codes;
  auto rails2edges_w = Write<LO>(nkeys, -1);
  auto rail_col_dirs_w = Write<I8>(nkeys, -1);
  auto edge_globals = mesh->globals(EDGE);
  auto f = OMEGA_H_LAMBDA(LO key) {
    auto v = keys2verts[key];
    auto rail_global = verts2rail[v];
    for (auto ve = v2ve[v]; ve < v2ve[v + 1]; ++ve) {
      auto e = ve2e[ve];
      auto edge_global = edge_globals[e];
      if (edge_global == rail_global) {
        auto ve_code = ve_codes[ve];
        auto eev = code_which_down(ve_code);
        rails2edges_w[key] = e;
        rail_col_dirs_w[key] = static_cast<I8>(eev);
        return;
      }
    }
    OMEGA_H_NORETURN();
  };
  parallel_for(nkeys, f, "find_rails");
  *rails2edges = rails2edges_w;
  *rail_col_dirs = rail_col_dirs_w;
}